

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyAbbrevSection(DWARFVerifier *this,DWARFDebugAbbrev *Abbrev)

{
  bool bVar1;
  DWARFAbbreviationDeclarationSet *this_00;
  reference pDVar2;
  AttributeSpec *pAVar3;
  raw_ostream *prVar4;
  attr_iterator_range aVar5;
  StringRef Str;
  unsigned_short local_162;
  undefined1 local_160 [8];
  pair<llvm::detail::DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>::Iterator,_bool>
  Result;
  AttributeSpec Attribute;
  AttributeSpec *__end3;
  AttributeSpec *__begin3;
  AttributeSpec *local_118;
  iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *local_110;
  attr_iterator_range *__range3;
  undefined1 local_f8 [8];
  SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> AttributeSet;
  DWARFAbbreviationDeclaration AbbrDecl;
  const_iterator __end2;
  const_iterator __begin2;
  DWARFAbbreviationDeclarationSet *__range2;
  DWARFAbbreviationDeclarationSet *AbbrDecls;
  uint NumErrors;
  DWARFDebugAbbrev *Abbrev_local;
  DWARFVerifier *this_local;
  
  AbbrDecls._4_4_ = 0;
  if (Abbrev != (DWARFDebugAbbrev *)0x0) {
    this_00 = DWARFDebugAbbrev::getAbbreviationDeclarationSet(Abbrev,0);
    __end2 = DWARFAbbreviationDeclarationSet::begin(this_00);
    AbbrDecl.FixedAttributeSize.Storage =
         (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)
         DWARFAbbreviationDeclarationSet::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_llvm::DWARFAbbreviationDeclaration_*,_std::vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>_>
                                       *)&AbbrDecl.FixedAttributeSize), bVar1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFAbbreviationDeclaration_*,_std::vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>_>
               ::operator*(&__end2);
      DWARFAbbreviationDeclaration::DWARFAbbreviationDeclaration
                ((DWARFAbbreviationDeclaration *)
                 (AttributeSet.
                  super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                  .TheMap.storage.buffer + 8),pDVar2);
      SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_>::SmallDenseSet
                ((SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> *)local_f8)
      ;
      aVar5 = DWARFAbbreviationDeclaration::attributes
                        ((DWARFAbbreviationDeclaration *)
                         (AttributeSet.
                          super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                          .TheMap.storage.buffer + 8));
      local_118 = aVar5.end_iterator;
      __begin3 = aVar5.begin_iterator;
      local_110 = (iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *)
                  &__begin3;
      __end3 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::begin
                         (local_110);
      pAVar3 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::end
                         (local_110);
      for (; __end3 != pAVar3; __end3 = __end3 + 1) {
        Result._16_8_ = *(undefined8 *)__end3;
        local_162 = Result._16_2_;
        detail::
        DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
        ::insert((pair<llvm::detail::DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>::Iterator,_bool>
                  *)local_160,
                 (DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                  *)local_f8,&local_162);
        if (((byte)Result.first.I.End & 1) == 0) {
          prVar4 = error(this);
          prVar4 = raw_ostream::operator<<(prVar4,"Abbreviation declaration contains multiple ");
          Str = dwarf::AttributeString((uint)(ushort)Result._16_2_);
          prVar4 = raw_ostream::operator<<(prVar4,Str);
          raw_ostream::operator<<(prVar4," attributes.\n");
          DWARFAbbreviationDeclaration::dump
                    ((DWARFAbbreviationDeclaration *)
                     (AttributeSet.
                      super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                      .TheMap.storage.buffer + 8),this->OS);
          AbbrDecls._4_4_ = AbbrDecls._4_4_ + 1;
        }
      }
      SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_>::~SmallDenseSet
                ((SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> *)local_f8)
      ;
      DWARFAbbreviationDeclaration::~DWARFAbbreviationDeclaration
                ((DWARFAbbreviationDeclaration *)
                 (AttributeSet.
                  super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                  .TheMap.storage.buffer + 8));
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFAbbreviationDeclaration_*,_std::vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>_>
      ::operator++(&__end2);
    }
  }
  return AbbrDecls._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyAbbrevSection(const DWARFDebugAbbrev *Abbrev) {
  unsigned NumErrors = 0;
  if (Abbrev) {
    const DWARFAbbreviationDeclarationSet *AbbrDecls =
        Abbrev->getAbbreviationDeclarationSet(0);
    for (auto AbbrDecl : *AbbrDecls) {
      SmallDenseSet<uint16_t> AttributeSet;
      for (auto Attribute : AbbrDecl.attributes()) {
        auto Result = AttributeSet.insert(Attribute.Attr);
        if (!Result.second) {
          error() << "Abbreviation declaration contains multiple "
                  << AttributeString(Attribute.Attr) << " attributes.\n";
          AbbrDecl.dump(OS);
          ++NumErrors;
        }
      }
    }
  }
  return NumErrors;
}